

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O1

int forkfd(int flags,pid_t *ppid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  int pidfd;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((flags & 4U) == 0) {
    local_2c = -0x55555556;
    iVar2 = system_forkfd_availability();
    iVar3 = iVar2;
    if (-1 < iVar2) {
      lVar4 = syscall(0x38,0x1011,0,&local_2c,0,0);
      iVar1 = local_2c;
      iVar3 = (int)lVar4;
      if (-1 < iVar3) {
        if (ppid != (pid_t *)0x0) {
          *ppid = iVar3;
        }
        if (iVar3 == 0) {
          iVar3 = -2;
        }
        else {
          system_forkfd_pidfd_set_flags(local_2c,flags);
          iVar3 = iVar1;
        }
      }
    }
    if (-1 < iVar2) goto LAB_00448a8b;
  }
  iVar3 = forkfd_fork_fallback(flags,ppid);
LAB_00448a8b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int forkfd(int flags, pid_t *ppid)
{
    int fd;
    if (disable_fork_fallback())
        flags &= ~FFD_USE_FORK;

    if ((flags & FFD_USE_FORK) == 0) {
        int system_forkfd_works;
        fd = system_forkfd(flags, ppid, &system_forkfd_works);
        if (system_forkfd_works || disable_fork_fallback())
            return fd;
    }

    return forkfd_fork_fallback(flags, ppid);
}